

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

string * testing::PrintToString<bool>(string *__return_storage_ptr__,bool *value)

{
  ostream *local_1a8;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream aoStack_190 [376];
  bool *local_18;
  bool *value_local;
  
  local_18 = value;
  value_local = (bool *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a8 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a0) {
    local_1a8 = aoStack_190;
  }
  internal::UniversalTersePrinter<bool>::Print(local_18,local_1a8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}